

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O1

size_t * scope_stack_return(scope sp)

{
  size_t sVar1;
  long *plVar2;
  char *message;
  
  if ((sp == (scope)0x0) || (sp->call_stack == (vector)0x0)) {
    message = "Scope stack return invalid parameters";
    sVar1 = 0x1fa;
  }
  else {
    sVar1 = vector_size(sp->call_stack);
    if (sVar1 < 8) {
      message = "Scope stack return empty";
      sVar1 = 0x1f5;
    }
    else {
      plVar2 = (long *)vector_at(sp->call_stack,sVar1 - 9);
      if ((plVar2 != (long *)0x0) && ((size_t *)*plVar2 != (size_t *)0x0)) {
        return (size_t *)*plVar2;
      }
      message = "Scope stack return invalid reference";
      sVar1 = 0x1f0;
    }
  }
  log_write_impl_va("metacall",sVar1,"scope_stack_return",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                    ,LOG_LEVEL_ERROR,message);
  return (size_t *)0x0;
}

Assistant:

size_t *scope_stack_return(scope sp)
{
	if (sp != NULL && sp->call_stack != NULL)
	{
		size_t call_stack_size = vector_size(sp->call_stack);

		if (call_stack_size >= sizeof(size_t))
		{
			size_t return_position = call_stack_size - 1 - sizeof(size_t);

			void **return_ptr = vector_at(sp->call_stack, return_position);

			if (return_ptr != NULL && *return_ptr != NULL)
			{
				size_t *size_return_ptr = *return_ptr;

				return size_return_ptr;
			}

			log_write("metacall", LOG_LEVEL_ERROR, "Scope stack return invalid reference");

			return NULL;
		}

		log_write("metacall", LOG_LEVEL_ERROR, "Scope stack return empty");

		return NULL;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Scope stack return invalid parameters");

	return NULL;
}